

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void amrex::VisMF::readFAB(FabArray<amrex::FArrayBox> *mf,int idx,string *mf_name,Header *hdr)

{
  bool bVar1;
  BaseFab<double> *this;
  FabOnDisk *pFVar2;
  ifstream *piVar3;
  RealDescriptor *fileName;
  Header *in_RCX;
  Real *in_RDX;
  Long readDataItems;
  Real *fabdata;
  ifstream *infs;
  string FullName;
  FArrayBox *fab;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff40;
  RealDescriptor *in_stack_ffffffffffffff48;
  undefined1 forceClose;
  RealDescriptor *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa8;
  string local_48 [24];
  RealDescriptor *in_stack_ffffffffffffffd0;
  
  this = &FabArray<amrex::FArrayBox>::operator[]
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c)->super_BaseFab<double>;
  DirName(in_stack_ffffffffffffffa8);
  pFVar2 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::operator[]
                     ((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_> *)
                      in_stack_ffffffffffffff40,
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::__cxx11::string::operator+=(local_48,(string *)pFVar2);
  piVar3 = OpenStream(in_stack_ffffffffffffff90);
  pFVar2 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::operator[]
                     ((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_> *)
                      in_stack_ffffffffffffff40,
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::istream::seekg((long)piVar3,(_Ios_Seekdir)pFVar2->m_head);
  bVar1 = NoFabHeader(in_RCX);
  if (bVar1) {
    fileName = (RealDescriptor *)
               BaseFab<double>::dataPtr
                         ((BaseFab<double> *)
                          CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                          (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    FPC::NativeRealDescriptor();
    bVar1 = RealDescriptor::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    forceClose = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
    if (bVar1) {
      BaseFab<double>::nBytes(this);
      std::istream::read((char *)piVar3,(long)fileName);
      forceClose = (undefined1)((ulong)piVar3 >> 0x38);
    }
    else {
      BaseFab<double>::box(this);
      Box::numPts((Box *)in_stack_ffffffffffffff50);
      BaseFab<double>::nComp(this);
      RealDescriptor::convertToNativeFormat
                (in_RDX,(Long)in_RCX,(istream *)this,in_stack_ffffffffffffffd0);
      fileName = in_stack_ffffffffffffff50;
    }
  }
  else {
    FArrayBox::readFrom((FArrayBox *)in_stack_ffffffffffffff50,(istream *)in_stack_ffffffffffffff48)
    ;
    forceClose = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
    fileName = in_stack_ffffffffffffff50;
  }
  CloseStream((string *)fileName,(bool)forceClose);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
VisMF::readFAB (FabArray<FArrayBox> &mf,
                int                  idx,
                const std::string&   mf_name,
                const VisMF::Header& hdr)
{
//    BL_PROFILE("VisMF::readFAB_mf");
    FArrayBox &fab = mf[idx];

    std::string FullName(VisMF::DirName(mf_name));
    FullName += hdr.m_fod[idx].m_name;

    std::ifstream *infs = VisMF::OpenStream(FullName);
    infs->seekg(hdr.m_fod[idx].m_head, std::ios::beg);

    if(NoFabHeader(hdr)) {
      Real* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
      std::unique_ptr<FArrayBox> hostfab;
      if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
          hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(), The_Pinned_Arena());
          fabdata = hostfab->dataPtr();
      }
#endif
      if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
        infs->read((char *) fabdata, fab.nBytes());
      } else {
        Long readDataItems(fab.box().numPts() * fab.nComp());
        RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                              *infs, hdr.m_writtenRD);
      }
#ifdef AMREX_USE_GPU
      if (hostfab) {
          Gpu::htod_memcpy_async(fab.dataPtr(), hostfab->dataPtr(), fab.size()*sizeof(Real));
          Gpu::streamSynchronize();
      }
#endif
    } else {
      fab.readFrom(*infs);
    }

    VisMF::CloseStream(FullName);
}